

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication.hpp
# Opt level: O2

void __thiscall diy::Master::InFlightRecv::reset(InFlightRecv *this)

{
  MemoryManagement mem_;
  MemoryManagement MStack_138;
  InFlightRecv local_d8;
  
  MemoryManagement::MemoryManagement(&MStack_138,&this->mem);
  memset(&local_d8,0,0xc0);
  InFlightRecv(&local_d8);
  operator=(this,&local_d8);
  ~InFlightRecv(&local_d8);
  MemoryManagement::operator=(&this->mem,&MStack_138);
  MemoryManagement::~MemoryManagement(&MStack_138);
  return;
}

Assistant:

void            reset()
        {
            MemoryManagement mem_ = mem;
            *this = InFlightRecv();
            mem = mem_;
        }